

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testCaseEnded(XmlReporter *this,TestCaseStats *testCaseStats)

{
  int iVar1;
  string local_58;
  double local_38;
  undefined1 local_30 [8];
  ScopedElement e;
  
  LazyStat<Catch::TestCaseInfo>::reset(&(this->super_StreamingReporterBase).currentTestCaseInfo);
  std::__cxx11::string::string((string *)&local_58,"OverallResult",(allocator *)&local_38);
  XmlWriter::scopedElement((XmlWriter *)local_30,(string *)&this->m_xml);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"success",(allocator *)&local_38);
  XmlWriter::writeAttribute
            ((XmlWriter *)local_30,&local_58,(testCaseStats->totals).assertions.failed == 0);
  std::__cxx11::string::~string((string *)&local_58);
  iVar1 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[0xc])();
  if (iVar1 == 1) {
    std::__cxx11::string::string
              ((string *)&local_58,"durationInSeconds",(allocator *)((long)&e.m_writer + 7));
    local_38 = Timer::getElapsedSeconds(&this->m_testCaseTimer);
    XmlWriter::writeAttribute<double>((XmlWriter *)local_30,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  XmlWriter::endElement(&this->m_xml);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_30);
  return;
}

Assistant:

virtual void testCaseEnded(TestCaseStats const& testCaseStats) CATCH_OVERRIDE {
			StreamingReporterBase::testCaseEnded(testCaseStats);
			XmlWriter::ScopedElement e = m_xml.scopedElement("OverallResult");
			e.writeAttribute("success", testCaseStats.totals.assertions.allOk());

			if (m_config->showDurations() == ShowDurations::Always)
				e.writeAttribute("durationInSeconds", m_testCaseTimer.getElapsedSeconds());

			m_xml.endElement();
		}